

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int impl_GLSL_CompileShader(MOJOSHADER_parseData *pd,GLuint *s)

{
  GLsizei local_3c;
  GLhandleARB local_38;
  GLsizei len_1;
  GLhandleARB shader_1;
  GLsizei len;
  GLuint shader;
  GLenum shader_type;
  GLint codelen;
  GLint ok;
  GLuint *s_local;
  MOJOSHADER_parseData *pd_local;
  
  shader_type = 0;
  shader = pd->output_len;
  _codelen = s;
  s_local = (GLuint *)pd;
  len = glsl_shader_type(pd->shader_type);
  if (ctx->have_opengl_2 == 0) {
    local_38 = (*ctx->glCreateShaderObjectARB)(len);
    (*ctx->glShaderSourceARB)(local_38,1,(GLcharARB **)(s_local + 6),(GLint *)&shader);
    (*ctx->glCompileShaderARB)(local_38);
    (*ctx->glGetObjectParameterivARB)(local_38,0x8b81,(GLint *)&shader_type);
    if (shader_type == 0) {
      local_3c = 0;
      (*ctx->glGetInfoLogARB)(local_38,0x400,&local_3c,error_buffer);
      (*ctx->glDeleteObjectARB)(local_38);
      *_codelen = 0;
      return 0;
    }
    *_codelen = local_38;
  }
  else {
    shader_1 = (*ctx->glCreateShader)(len);
    (*ctx->glShaderSource)(shader_1,1,(GLchar **)(s_local + 6),(GLint *)&shader);
    (*ctx->glCompileShader)(shader_1);
    (*ctx->glGetShaderiv)(shader_1,0x8b81,(GLint *)&shader_type);
    if (shader_type == 0) {
      len_1 = 0;
      (*ctx->glGetShaderInfoLog)(shader_1,0x400,&len_1,error_buffer);
      (*ctx->glDeleteShader)(shader_1);
      *_codelen = 0;
      return 0;
    }
    *_codelen = shader_1;
  }
  return 1;
}

Assistant:

static int impl_GLSL_CompileShader(const MOJOSHADER_parseData *pd, GLuint *s)
{
    GLint ok = 0;
    const GLint codelen = (GLint) pd->output_len;
    const GLenum shader_type = glsl_shader_type(pd->shader_type);

    if (ctx->have_opengl_2)
    {
        const GLuint shader = ctx->glCreateShader(shader_type);
        ctx->glShaderSource(shader, 1, (const GLchar**) &pd->output, &codelen);
        ctx->glCompileShader(shader);
        ctx->glGetShaderiv(shader, GL_COMPILE_STATUS, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetShaderInfoLog(shader, sizeof (error_buffer), &len,
                                 (GLchar *) error_buffer);
            ctx->glDeleteShader(shader);
            *s = 0;
            return 0;
        } // if

        *s = shader;
    } // if
    else
    {
        const GLhandleARB shader = ctx->glCreateShaderObjectARB(shader_type);
        assert(sizeof (shader) == sizeof (*s));  // not always true on OS X!
        ctx->glShaderSourceARB(shader, 1,
                              (const GLcharARB **) &pd->output, &codelen);
        ctx->glCompileShaderARB(shader);
        ctx->glGetObjectParameterivARB(shader,GL_OBJECT_COMPILE_STATUS_ARB,&ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetInfoLogARB(shader, sizeof (error_buffer), &len,
                                 (GLcharARB *) error_buffer);
            ctx->glDeleteObjectARB(shader);
            *s = 0;
            return 0;
        } // if

        *s = (GLuint) shader;
    } // else

    return 1;
}